

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkUpdateLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  Abc_Obj_t *pObj;
  void *Entry;
  uint uVar4;
  long lVar5;
  uint Level;
  long lVar6;
  ulong uVar7;
  
  uVar1 = *(uint *)&pObjNew->field_0x14;
  Level = uVar1 >> 0xc;
  uVar4 = Abc_ObjLevelNew(pObjNew);
  if (Level != uVar4) {
    iVar2 = vLevels->nSize;
    if (0 < (long)iVar2) {
      ppvVar3 = vLevels->pArray;
      lVar5 = 0;
      do {
        *(undefined4 *)((long)ppvVar3[lVar5] + 4) = 0;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    Vec_VecPush(vLevels,Level,pObjNew);
    pObjNew->field_0x14 = pObjNew->field_0x14 | 0x10;
    if ((int)Level < vLevels->nSize) {
      uVar7 = (ulong)(uVar1 >> 0xc);
      do {
        if ((long)vLevels->nSize <= (long)uVar7) {
LAB_002b59fc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        lVar5 = 0;
        while (lVar5 < *(int *)((long)vLevels->pArray[uVar7] + 4)) {
          pObj = *(Abc_Obj_t **)(*(long *)((long)vLevels->pArray[uVar7] + 8) + lVar5 * 8);
          uVar1 = *(uint *)&pObj->field_0x14;
          *(uint *)&pObj->field_0x14 = uVar1 & 0xffffffef;
          if (uVar7 != uVar1 >> 0xc) {
            __assert_fail("Abc_ObjLevel(pTemp) == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                          ,0x514,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
          }
          uVar4 = Abc_ObjLevelNew(pObj);
          *(uint *)&pObj->field_0x14 = uVar1 & 0xfef | uVar4 << 0xc;
          if ((uVar7 != (uVar4 & 0xfffff)) && (0 < (pObj->vFanouts).nSize)) {
            lVar6 = 0;
            do {
              Entry = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
              uVar1 = *(uint *)((long)Entry + 0x14);
              if (((uVar1 & 0x10) == 0) && ((uVar1 & 0xf) - 5 < 0xfffffffe)) {
                if (uVar1 >> 0xc < uVar7) {
                  __assert_fail("Abc_ObjLevel(pFanout) >= Lev",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                                ,0x51e,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
                }
                Vec_VecPush(vLevels,uVar1 >> 0xc,Entry);
                *(byte *)((long)Entry + 0x14) = *(byte *)((long)Entry + 0x14) | 0x10;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (pObj->vFanouts).nSize);
          }
          lVar5 = lVar5 + 1;
          if ((long)vLevels->nSize <= (long)uVar7) goto LAB_002b59fc;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)vLevels->nSize);
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanout, * pTemp;
    int LevelOld, Lev, k, m;
//    int Counter = 0, CounterMax = 0;
    // check if level has changed
    LevelOld = Abc_ObjLevel(pObjNew);
    if ( LevelOld == Abc_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
//        Counter--;
        pTemp->fMarkA = 0;
        assert( Abc_ObjLevel(pTemp) == Lev );
        Abc_ObjSetLevel( pTemp, Abc_ObjLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Abc_ObjForEachFanout( pTemp, pFanout, m )
        {
            if ( !Abc_ObjIsCo(pFanout) && !pFanout->fMarkA )
            {
                assert( Abc_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( vLevels, Abc_ObjLevel(pFanout), pFanout );
//                Counter++;
//                CounterMax = Abc_MaxFloat( CounterMax, Counter );
                pFanout->fMarkA = 1;
            }
        }
    }
//    printf( "%d ", CounterMax );
}